

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
cmFileAPI::GetConfigureLogVersions
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          cmFileAPI *this)

{
  bool bVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_98;
  const_iterator local_90;
  unsigned_long *local_88;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78;
  const_iterator local_70;
  unsigned_long *local_68;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  reference local_58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>
  *client;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>_>
  *__range1;
  anon_class_8_1_719aa419 local_28;
  anon_class_8_1_719aa419 getConfigureLogVersions;
  cmFileAPI *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *versions;
  
  getConfigureLogVersions.versions._7_1_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__);
  local_28.versions = __return_storage_ptr__;
  GetConfigureLogVersions::anon_class_8_1_719aa419::operator()(&local_28,&this->TopQuery);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>_>
           ::begin(&this->ClientQueries);
  client = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>_>
              ::end(&this->ClientQueries);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&client), bVar1) {
    local_58 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>
               ::operator*(&__end1);
    GetConfigureLogVersions::anon_class_8_1_719aa419::operator()
              (&local_28,&(local_58->second).DirQuery);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>
    ::operator++(&__end1);
  }
  local_60._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(__return_storage_ptr__);
  local_68 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__)
  ;
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (local_60,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       )local_68);
  local_80._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(__return_storage_ptr__);
  local_88 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__)
  ;
  local_78 = std::
             unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (local_80,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_88);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_70,&local_78);
  local_98._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_90,&local_98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            (__return_storage_ptr__,local_70,local_90);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned long> cmFileAPI::GetConfigureLogVersions()
{
  std::vector<unsigned long> versions;
  auto getConfigureLogVersions = [&versions](Query const& q) {
    for (Object const& o : q.Known) {
      if (o.Kind == ObjectKind::ConfigureLog) {
        versions.emplace_back(o.Version);
      }
    }
  };
  getConfigureLogVersions(this->TopQuery);
  for (auto const& client : this->ClientQueries) {
    getConfigureLogVersions(client.second.DirQuery);
  }
  std::sort(versions.begin(), versions.end());
  versions.erase(std::unique(versions.begin(), versions.end()),
                 versions.end());
  return versions;
}